

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
add_matrix<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                  vector<double,_std::allocator<double>_> *a,
                  vector<double,_std::allocator<double>_> *b)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  allocator_type local_21;
  
  uVar5 = (ulong)((long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar4 = (int)uVar5;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar4,&local_21)
  ;
  pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pdVar3[uVar6] = pdVar1[uVar6] + pdVar2[uVar6];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> add_matrix(const std::vector<T>& a, const std::vector<T>& b){
    int n = a.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
        ans[i] = a[i] + b[i];
    return ans;
}